

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

int __thiscall
CVmObjStringBuffer::getp_copyChars
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  vm_val_t *pvVar2;
  int iVar3;
  int iVar4;
  ushort *puVar5;
  int32_t del_chars;
  ushort *puVar6;
  vm_val_t srcval;
  vm_val_t local_40;
  
  if (getp_copyChars(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_copyChars();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_copyChars::desc);
  if (iVar3 == 0) {
    iVar4 = CVmBif::pop_int_val();
    iVar3 = -1;
    if (iVar4 < 0) {
      iVar3 = *(int *)(this->super_CVmObject).ext_;
    }
    puVar5 = (ushort *)vm_val_t::cast_to_string(sp_ + -1,&local_40);
    pvVar2 = sp_;
    pvVar2[-1].typ = local_40.typ;
    *(undefined4 *)&pvVar2[-1].field_0x4 = local_40._4_4_;
    pvVar2[-1].val = local_40.val;
    uVar1 = *puVar5;
    if ((ulong)uVar1 == 0) {
      del_chars = 0;
    }
    else {
      del_chars = 0;
      puVar6 = puVar5 + 1;
      do {
        puVar6 = (ushort *)
                 ((long)puVar6 +
                 (ulong)((((byte)*puVar6 >> 5 & 1) != 0) + 1 & (uint)(byte)((byte)*puVar6 >> 7) * 3)
                 + 1);
        del_chars = del_chars + 1;
      } while (puVar6 < (ushort *)((long)puVar5 + (ulong)uVar1 + 2));
    }
    splice_text(this,self,iVar3 + iVar4,del_chars,(char *)(puVar5 + 1),(uint)uVar1,1);
    sp_ = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_copyChars(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the insertion index; adjust to 0-based or end-based indexing */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* get or cast the string; leave it on the stack for gc protection */
    vm_val_t srcval;
    const char *src = G_stk->get(0)->cast_to_string(vmg_ &srcval);
    *G_stk->get(0) = srcval;

    /* 
     *   Get the character length of the new text.  This is the number of
     *   characters we're overwriting (effectively deleting) in the current
     *   buffer.  
     */
    size_t src_bytes = vmb_get_len(src);
    src += VMB_LEN;
    
    /* get the new text's character length */
    utf8_ptr srcp((char *)src);
    size_t src_chars = srcp.len(src_bytes);

    /* splice the text */
    splice_text(vmg_ self, idx, src_chars, src, src_bytes, TRUE);

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    retval->set_obj(self);
    return TRUE;
}